

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
tfnw::TransferFunctionWidget::get_colormapf
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          TransferFunctionWidget *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer pfVar3;
  uint in_EAX;
  ulong uVar4;
  undefined8 uStack_18;
  
  this->colormap_changed = false;
  uStack_18 = (ulong)in_EAX;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,
             (long)(this->current_colormap).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->current_colormap).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,(value_type_conflict2 *)((long)&uStack_18 + 4),
             (allocator_type *)((long)&uStack_18 + 3));
  puVar1 = (this->current_colormap).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->current_colormap).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar3 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < (ulong)((long)puVar2 - (long)puVar1); uVar4 = uVar4 + 1) {
    pfVar3[uVar4] = (float)puVar1[uVar4] / 255.0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> TransferFunctionWidget::get_colormapf()
{
    colormap_changed = false;
    std::vector<float> colormapf(current_colormap.size(), 0.f);
    for (size_t i = 0; i < current_colormap.size(); ++i) {
        colormapf[i] = current_colormap[i] / 255.f;
    }
    return colormapf;
}